

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flatten.cpp
# Opt level: O2

Pass * wasm::createFlattenPass(void)

{
  Flatten *this;
  
  this = (Flatten *)operator_new(0x210);
  memset(this,0,0x210);
  Flatten::Flatten(this);
  return (Pass *)this;
}

Assistant:

Pass* createFlattenPass() { return new Flatten(); }